

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_propagator.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateExpression
          (StatisticsPropagator *this,Expression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  BoundAggregateExpression *expr_ptr_00;
  BoundCastExpression *expr_ptr_01;
  BoundConjunctionExpression *expr_ptr_02;
  BoundCaseExpression *expr_ptr_03;
  BoundConstantExpression *expr_ptr_04;
  BoundFunctionExpression *expr_ptr_05;
  BoundColumnRefExpression *expr_ptr_06;
  BoundComparisonExpression *expr_ptr_07;
  BoundBetweenExpression *expr_ptr_08;
  BoundOperatorExpression *expr_ptr_09;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  switch(*(undefined1 *)
          ((long)&expr_ptr[1].
                  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                  _M_t.
                  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                  .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 1)) {
  case 0x19:
    expr_ptr_00 = BaseExpression::Cast<duckdb::BoundAggregateExpression>((BaseExpression *)expr_ptr)
    ;
    PropagateExpression(this,(BoundAggregateExpression *)expr,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)expr_ptr_00);
    break;
  case 0x1a:
    expr_ptr_03 = BaseExpression::Cast<duckdb::BoundCaseExpression>((BaseExpression *)expr_ptr);
    PropagateExpression(this,(BoundCaseExpression *)expr,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)expr_ptr_03);
    break;
  case 0x1b:
    expr_ptr_01 = BaseExpression::Cast<duckdb::BoundCastExpression>((BaseExpression *)expr_ptr);
    PropagateExpression(this,(BoundCastExpression *)expr,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)expr_ptr_01);
    break;
  case 0x1c:
    expr_ptr_06 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>((BaseExpression *)expr_ptr)
    ;
    PropagateExpression(this,(BoundColumnRefExpression *)expr,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)expr_ptr_06);
    break;
  case 0x1d:
    expr_ptr_07 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                            ((BaseExpression *)expr_ptr);
    PropagateExpression(this,(BoundComparisonExpression *)expr,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)expr_ptr_07);
    break;
  case 0x1e:
    expr_ptr_02 = BaseExpression::Cast<duckdb::BoundConjunctionExpression>
                            ((BaseExpression *)expr_ptr);
    PropagateExpression(this,(BoundConjunctionExpression *)expr,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)expr_ptr_02);
    break;
  case 0x1f:
    expr_ptr_04 = BaseExpression::Cast<duckdb::BoundConstantExpression>((BaseExpression *)expr_ptr);
    PropagateExpression(this,(BoundConstantExpression *)expr,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)expr_ptr_04);
    break;
  default:
    local_38._8_8_ = 0;
    local_20 = ::std::
               _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/statistics_propagator.cpp:123:46)>
               ::_M_invoke;
    local_28 = ::std::
               _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/statistics_propagator.cpp:123:46)>
               ::_M_manager;
    local_38._M_unused._M_object = expr;
    ExpressionIterator::EnumerateChildren
              ((Expression *)expr_ptr,
               (function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_&)>
                *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    this->optimizer = (Optimizer *)0x0;
    break;
  case 0x21:
    expr_ptr_05 = BaseExpression::Cast<duckdb::BoundFunctionExpression>((BaseExpression *)expr_ptr);
    PropagateExpression(this,(BoundFunctionExpression *)expr,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)expr_ptr_05);
    break;
  case 0x22:
    expr_ptr_09 = BaseExpression::Cast<duckdb::BoundOperatorExpression>((BaseExpression *)expr_ptr);
    PropagateExpression(this,(BoundOperatorExpression *)expr,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)expr_ptr_09);
    break;
  case 0x27:
    expr_ptr_08 = BaseExpression::Cast<duckdb::BoundBetweenExpression>((BaseExpression *)expr_ptr);
    PropagateExpression(this,(BoundBetweenExpression *)expr,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)expr_ptr_08);
  }
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> StatisticsPropagator::PropagateExpression(Expression &expr,
                                                                     unique_ptr<Expression> &expr_ptr) {
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::BOUND_AGGREGATE:
		return PropagateExpression(expr.Cast<BoundAggregateExpression>(), expr_ptr);
	case ExpressionClass::BOUND_BETWEEN:
		return PropagateExpression(expr.Cast<BoundBetweenExpression>(), expr_ptr);
	case ExpressionClass::BOUND_CASE:
		return PropagateExpression(expr.Cast<BoundCaseExpression>(), expr_ptr);
	case ExpressionClass::BOUND_CONJUNCTION:
		return PropagateExpression(expr.Cast<BoundConjunctionExpression>(), expr_ptr);
	case ExpressionClass::BOUND_FUNCTION:
		return PropagateExpression(expr.Cast<BoundFunctionExpression>(), expr_ptr);
	case ExpressionClass::BOUND_CAST:
		return PropagateExpression(expr.Cast<BoundCastExpression>(), expr_ptr);
	case ExpressionClass::BOUND_COMPARISON:
		return PropagateExpression(expr.Cast<BoundComparisonExpression>(), expr_ptr);
	case ExpressionClass::BOUND_CONSTANT:
		return PropagateExpression(expr.Cast<BoundConstantExpression>(), expr_ptr);
	case ExpressionClass::BOUND_COLUMN_REF:
		return PropagateExpression(expr.Cast<BoundColumnRefExpression>(), expr_ptr);
	case ExpressionClass::BOUND_OPERATOR:
		return PropagateExpression(expr.Cast<BoundOperatorExpression>(), expr_ptr);
	default:
		break;
	}
	ExpressionIterator::EnumerateChildren(expr, [&](unique_ptr<Expression> &child) { PropagateExpression(child); });
	return nullptr;
}